

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::addNode(Graph *this,Node *node)

{
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> local_20;
  Node *local_18;
  Node *node_local;
  Graph *this_local;
  
  local_18 = node;
  node_local = &this->bad;
  std::unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>>::
  unique_ptr<std::default_delete<wasm::DataFlow::Node>,void>
            ((unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>> *)&local_20
             ,node);
  std::
  vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
  ::push_back(&this->nodes,(value_type *)&local_20);
  std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>::~unique_ptr
            (&local_20);
  return local_18;
}

Assistant:

Node* addNode(Node* node) {
    nodes.push_back(std::unique_ptr<Node>(node));
    return node;
  }